

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<double>::ParseNan(char *s,char *end,Uint *out_bits)

{
  bool bVar1;
  Result result;
  Uint UVar2;
  uint local_3c;
  ulong uStack_38;
  uint32_t digit;
  Uint tag;
  Uint *pUStack_28;
  bool is_neg;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  tag._7_1_ = 0;
  if (*s == '-') {
    tag._7_1_ = 1;
    end_local = s + 1;
  }
  else {
    end_local = s;
    if (*s == '+') {
      end_local = s + 1;
    }
  }
  pUStack_28 = out_bits;
  out_bits_local = (Uint *)end;
  bVar1 = StringStartsWith(end_local,end,"nan");
  if (!bVar1) {
    __assert_fail("StringStartsWith(s, end, \"nan\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                  ,0xd9,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                 );
  }
  end_local = end_local + 3;
  if ((Uint *)end_local == out_bits_local) {
    uStack_38 = 0x8000000000000;
  }
  else {
    uStack_38 = 0;
    bVar1 = StringStartsWith(end_local,(char *)out_bits_local,":0x");
    if (!bVar1) {
      __assert_fail("StringStartsWith(s, end, \":0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0xdf,
                    "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseNan(const char *, const char *, Uint *) [T = double]"
                   );
    }
    for (end_local = end_local + 3; end_local < out_bits_local; end_local = end_local + 1) {
      if (*end_local != '_') {
        result = ParseHexdigit(*end_local,&local_3c);
        bVar1 = Failed(result);
        if (bVar1) {
          Result::Result((Result *)((long)&s_local + 4),Error);
          return (Result)s_local._4_4_;
        }
        uStack_38 = uStack_38 * 0x10 + (ulong)local_3c;
        if (0xfffffffffffff < uStack_38) {
          Result::Result((Result *)((long)&s_local + 4),Error);
          return (Result)s_local._4_4_;
        }
      }
    }
    if (uStack_38 == 0) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
  }
  UVar2 = Make((bool)(tag._7_1_ & 1),0x400,uStack_38);
  *pUStack_28 = UVar2;
  Result::Result((Result *)((long)&s_local + 4),Ok);
  return (Result)s_local._4_4_;
}

Assistant:

Result FloatParser<T>::ParseNan(const char* s,
                                const char* end,
                                Uint* out_bits) {
  bool is_neg = false;
  if (*s == '-') {
    is_neg = true;
    s++;
  } else if (*s == '+') {
    s++;
  }
  assert(StringStartsWith(s, end, "nan"));
  s += 3;

  Uint tag;
  if (s != end) {
    tag = 0;
    assert(StringStartsWith(s, end, ":0x"));
    s += 3;

    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit;
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      tag = tag * 16 + digit;
      // Check for overflow.
      if (tag > Traits::kSigMask) {
        return Result::Error;
      }
    }

    // NaN cannot have a zero tag, that is reserved for infinity.
    if (tag == 0) {
      return Result::Error;
    }
  } else {
    tag = Traits::kQuietNanTag;
  }

  *out_bits = Make(is_neg, Traits::kMaxExp, tag);
  return Result::Ok;
}